

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecsMajor.hpp
# Opt level: O2

void __thiscall sciplot::TicsSpecsMajor::TicsSpecsMajor(TicsSpecsMajor *this,string *axis)

{
  runtime_error *this_00;
  
  *(undefined ***)
   &(this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>).
    super_TextSpecsOf<sciplot::TicsSpecsMajor>.super_FontSpecsOf<sciplot::TicsSpecsMajor> =
       &PTR__Specs_001afb98;
  TicsSpecsBaseOf<sciplot::TicsSpecsMajor>::TicsSpecsBaseOf
            (&this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>,&PTR_PTR_001ada00);
  *(undefined ***)
   &(this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>).
    super_TextSpecsOf<sciplot::TicsSpecsMajor>.super_FontSpecsOf<sciplot::TicsSpecsMajor> =
       &PTR__TicsSpecsMajor_001ad960;
  *(undefined ***)
   &(this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>).
    super_OffsetSpecsOf<sciplot::TicsSpecsMajor> = &PTR__TicsSpecsMajor_001ad9a0;
  *(undefined ***)
   &(this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>).
    super_ShowSpecsOf<sciplot::TicsSpecsMajor> = &PTR__TicsSpecsMajor_001ad9e0;
  std::__cxx11::string::string((string *)&this->m_axis,(string *)axis);
  (this->m_start)._M_dataplus._M_p = (pointer)&(this->m_start).field_2;
  (this->m_start)._M_string_length = 0;
  (this->m_start).field_2._M_local_buf[0] = '\0';
  (this->m_increment)._M_dataplus._M_p = (pointer)&(this->m_increment).field_2;
  (this->m_increment)._M_string_length = 0;
  (this->m_increment).field_2._M_local_buf[0] = '\0';
  (this->m_end)._M_dataplus._M_p = (pointer)&(this->m_end).field_2;
  (this->m_end)._M_string_length = 0;
  (this->m_end).field_2._M_local_buf[0] = '\0';
  (this->m_at)._M_dataplus._M_p = (pointer)&(this->m_at).field_2;
  (this->m_at)._M_string_length = 0;
  (this->m_at).field_2._M_local_buf[0] = '\0';
  (this->m_add)._M_dataplus._M_p = (pointer)&(this->m_add).field_2;
  (this->m_add)._M_string_length = 0;
  (this->m_add).field_2._M_local_buf[0] = '\0';
  (this->m_logscale)._M_dataplus._M_p = (pointer)&(this->m_logscale).field_2;
  (this->m_logscale)._M_string_length = 0;
  (this->m_logscale).field_2._M_local_buf[0] = '\0';
  if (axis->_M_string_length != 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "You have provided an empty string in `axis` argument of constructor TicsSpecsMajor(axis)."
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline TicsSpecsMajor::TicsSpecsMajor(std::string axis)
: TicsSpecsBaseOf<TicsSpecsMajor>(), m_axis(axis)
{
    if(axis.empty())
        throw std::runtime_error("You have provided an empty string "
            "in `axis` argument of constructor TicsSpecsMajor(axis).");
}